

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O3

int enet_socket_send(ENetSocket socket,ENetAddress *address,ENetBuffer *buffers,size_t bufferCount)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  msghdr msgHdr;
  msghdr local_48;
  undefined2 local_10;
  ushort local_e;
  enet_uint32 local_c;
  undefined8 local_8;
  
  local_48.msg_name = (undefined2 *)0x0;
  local_48.msg_namelen = 0;
  local_48._12_4_ = 0;
  local_48.msg_control = (void *)0x0;
  local_48.msg_controllen = 0;
  local_48.msg_flags = 0;
  local_48._52_4_ = 0;
  if (address != (ENetAddress *)0x0) {
    local_48.msg_name = &local_10;
    local_8 = 0;
    local_10 = 2;
    local_e = address->port << 8 | address->port >> 8;
    local_c = address->host;
    local_48.msg_namelen = 0x10;
    local_48._12_4_ = 0;
  }
  local_48.msg_iov = (iovec *)buffers;
  local_48.msg_iovlen = bufferCount;
  sVar2 = sendmsg(socket,&local_48,0x4000);
  iVar1 = (int)sVar2;
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    iVar1 = -(uint)(*piVar3 != 0xb);
  }
  return iVar1;
}

Assistant:

int
enet_socket_send (ENetSocket socket,
                  const ENetAddress * address,
                  const ENetBuffer * buffers,
                  size_t bufferCount)
{
    struct msghdr msgHdr;
    struct sockaddr_in sin;
    int sentLength;

    memset (& msgHdr, 0, sizeof (struct msghdr));

    if (address != NULL)
    {
        memset (& sin, 0, sizeof (struct sockaddr_in));

        sin.sin_family = AF_INET;
        sin.sin_port = ENET_HOST_TO_NET_16 (address -> port);
        sin.sin_addr.s_addr = address -> host;

        msgHdr.msg_name = & sin;
        msgHdr.msg_namelen = sizeof (struct sockaddr_in);
    }

    msgHdr.msg_iov = (struct iovec *) buffers;
    msgHdr.msg_iovlen = bufferCount;

    sentLength = sendmsg (socket, & msgHdr, MSG_NOSIGNAL);
    
    if (sentLength == -1)
    {
       if (errno == EWOULDBLOCK)
         return 0;

       return -1;
    }

    return sentLength;
}